

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O3

int Abc_NtkRetimeMinAreaInitValues_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Obj_t *pObj_00;
  uint uVar4;
  int iVar5;
  int in_EDX;
  int Fill;
  long lVar6;
  
  pAVar2 = pObj->pNtk;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,in_EDX);
  if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pObj->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar5] == iVar1) {
    iVar5 = (pObj->field_6).iTemp;
  }
  else {
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
    if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar5] = iVar1;
    uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar4 == 5) {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
      if ((*(uint *)&pObj_00->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(Abc_ObjFanin0(pObj))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retArea.c"
                      ,0x113,"int Abc_NtkRetimeMinAreaInitValues_rec(Abc_Obj_t *)");
      }
      iVar5 = Abc_NtkRetimeMinAreaInitValues_rec(pObj_00);
    }
    else {
      if (uVar4 != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retArea.c"
                      ,0x117,"int Abc_NtkRetimeMinAreaInitValues_rec(Abc_Obj_t *)");
      }
      if (0 < (pObj->vFanins).nSize) {
        lVar6 = 0;
        do {
          Abc_NtkRetimeMinAreaInitValues_rec
                    ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar6]]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pObj->vFanins).nSize);
      }
      iVar5 = Abc_ObjSopSimulate(pObj);
    }
    pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar5;
  }
  return iVar5;
}

Assistant:

int Abc_NtkRetimeMinAreaInitValues_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return (int)(ABC_PTRUINT_T)pObj->pCopy;
    Abc_NodeSetTravIdCurrent(pObj);
    // consider the case of a latch output
    if ( Abc_ObjIsBo(pObj) )
    {
        assert( Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_NtkRetimeMinAreaInitValues_rec( Abc_ObjFanin0(pObj) );
        return (int)(ABC_PTRUINT_T)pObj->pCopy;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkRetimeMinAreaInitValues_rec( pFanin );
    // compute the value of the node
    pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate(pObj);
    return (int)(ABC_PTRUINT_T)pObj->pCopy;
}